

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcSymLocal * __thiscall
CTcPrsSymtab::add_local
          (CTcPrsSymtab *this,textchar_t *sym,size_t len,int param_3,int copy_str,int init_assigned,
          int init_referenced)

{
  int iVar1;
  undefined4 extraout_var;
  CTcSymLocalBase *this_00;
  textchar_t *siz;
  
  siz = sym;
  iVar1 = (*this->_vptr_CTcPrsSymtab[2])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this_00 = (CTcSymLocalBase *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x68,(size_t)siz);
    CTcSymLocal::CTcSymLocal((CTcSymLocal *)this_00,sym,len,copy_str,0,param_3);
    if (init_assigned != 0) {
      CTcSymLocalBase::set_val_assigned(this_00,1);
    }
    if (init_referenced != 0) {
      CTcSymLocalBase::set_val_used(this_00,1);
    }
    (*this->_vptr_CTcPrsSymtab[3])(this,this_00);
  }
  else {
    this_00 = (CTcSymLocalBase *)0x0;
    CTcTokenizer::log_error(0x2b37,len & 0xffffffff,sym);
  }
  return (CTcSymLocal *)this_00;
}

Assistant:

CTcSymLocal *CTcPrsSymtab::add_local(const textchar_t *sym, size_t len,
                                     int local_num, int copy_str,
                                     int init_assigned, int init_referenced)
{
    CTcSymLocal *lcl;

    /* 
     *   make sure the symbol isn't already defined in this scope; if it
     *   is, log an error 
     */
    if (find_direct(sym, len) != 0)
    {
        /* log the error */
        G_tok->log_error(TCERR_LOCAL_REDEF, (int)len, sym);

        /* don't create the symbol again - return the original definition */
        return 0;
    }

    /* create the symbol entry */
    lcl = new CTcSymLocal(sym, len, copy_str, FALSE, local_num);

    /* 
     *   if the symbol is initially to be marked as referenced or
     *   assigned, mark it now 
     */
    if (init_assigned)
        lcl->set_val_assigned(TRUE);
    if (init_referenced)
        lcl->set_val_used(TRUE);
    
    /* add it to the table */
    add_entry(lcl);

    /* return the new local */
    return lcl;
}